

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O0

char * fmt::v11::detail::invoke_parse<char_const(&)[3],char>(parse_context<char> *ctx)

{
  char *pcVar1;
  bool formattable;
  undefined1 local_40 [16];
  parse_context<char> *in_stack_ffffffffffffffd0;
  native_formatter<const_char_*,_char,_(fmt::v11::detail::type)12> *in_stack_ffffffffffffffd8;
  
  memset(local_40,0,0x30);
  formatter<const_char_*,_char,_void>::formatter((formatter<const_char_*,_char,_void> *)0x2a8629);
  pcVar1 = native_formatter<const_char_*,_char,_(fmt::v11::detail::type)12>::parse
                     (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return pcVar1;
}

Assistant:

FMT_CONSTEXPR auto invoke_parse(parse_context<Char>& ctx) -> const Char* {
  using mapped_type = remove_cvref_t<mapped_t<T, Char>>;
  constexpr bool formattable =
      std::is_constructible<formatter<mapped_type, Char>>::value;
  if (!formattable) return ctx.begin();  // Error is reported in the value ctor.
  using formatted_type = conditional_t<formattable, mapped_type, int>;
  return formatter<formatted_type, Char>().parse(ctx);
}